

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v5::internal::
     set_dynamic_spec<fmt::v5::internal::precision_checker,int,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,fmt::v5::internal::error_handler>
               (undefined4 *value,error_handler *param_2)

{
  int iVar1;
  type tVar2;
  undefined1 arg [32];
  precision_checker<fmt::v5::internal::error_handler> local_28;
  type local_20;
  unsigned_long_long big_value;
  undefined4 *local_10;
  int *value_local;
  
  big_value = (unsigned_long_long)param_2;
  local_10 = value;
  precision_checker<fmt::v5::internal::error_handler>::precision_checker(&local_28,param_2);
  tVar2 = visit<fmt::v5::internal::precision_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                    (&local_28,
                     (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                      )arg);
  local_20 = tVar2;
  iVar1 = std::numeric_limits<int>::max();
  if ((ulong)(long)iVar1 < tVar2) {
    error_handler::on_error(param_2,"number is too big");
  }
  *local_10 = (int)local_20;
  return;
}

Assistant:

FMT_CONSTEXPR void set_dynamic_spec(
    T &value, basic_format_arg<Context> arg, ErrorHandler eh) {
  unsigned long long big_value = visit(Handler<ErrorHandler>(eh), arg);
  if (big_value > (std::numeric_limits<int>::max)())
    eh.on_error("number is too big");
  value = static_cast<T>(big_value);
}